

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

bool __thiscall
google::protobuf::Reflection::HasField(Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  int number;
  Reflection *pRVar2;
  Descriptor *actual;
  Descriptor *pDVar3;
  ExtensionSet *this_00;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  pRVar2 = Message::GetReflection(message);
  if (this != pRVar2) {
    pDVar3 = this->descriptor_;
    actual = Message::GetDescriptor(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar3,actual,field,"HasField");
  }
  pDVar3 = FieldDescriptor::containing_type(field);
  if (pDVar3 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"HasField","Field does not match message type.");
  }
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"HasField",
               "Field is repeated; the method requires a singular field.");
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = GetExtensionSet(this,message);
    number = FieldDescriptor::number(field);
    this_local._7_1_ = internal::ExtensionSet::Has(this_00,number);
  }
  else {
    bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
    if (bVar1) {
      this_local._7_1_ = HasOneofField(this,message,field);
    }
    else {
      this_local._7_1_ = HasFieldSingular(this,message,field);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Reflection::HasField(const Message& message,
                          const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE(HasField, &message);
  USAGE_CHECK_MESSAGE_TYPE(HasField);
  USAGE_CHECK_SINGULAR(HasField);

  if (field->is_extension()) {
    return GetExtensionSet(message).Has(field->number());
  } else {
    if (schema_.InRealOneof(field)) {
      return HasOneofField(message, field);
    } else {
      return HasFieldSingular(message, field);
    }
  }
}